

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared_device_buffer.h
# Opt level: O0

void __thiscall
gpu::shared_device_buffer_typed<double>::shared_device_buffer_typed
          (shared_device_buffer_typed<double> *this,shared_device_buffer_typed<double> *other,
          size_t offset)

{
  size_t offset_local;
  shared_device_buffer_typed<double> *other_local;
  shared_device_buffer_typed<double> *this_local;
  
  shared_device_buffer::shared_device_buffer
            (&this->super_shared_device_buffer,&other->super_shared_device_buffer,offset << 3);
  return;
}

Assistant:

shared_device_buffer_typed(const shared_device_buffer_typed &other, size_t offset) : shared_device_buffer(other, offset * sizeof(T)) {}